

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_NV_CERTIFY_INFO_Unmarshal(TPMS_NV_CERTIFY_INFO *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  TVar3 = TPM2B_NAME_Unmarshal(&target->indexName,buffer,size);
  if (TVar3 == 0) {
    iVar1 = *size;
    *size = iVar1 + -2;
    TVar3 = 0x9a;
    if (1 < iVar1) {
      UVar2 = ByteArrayToUint16(*buffer);
      target->offset = UVar2;
      *buffer = *buffer + 2;
      TVar3 = TPM2B_MAX_NV_BUFFER_Unmarshal(&target->nvContents,buffer,size);
      return TVar3;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMS_NV_CERTIFY_INFO_Unmarshal(TPMS_NV_CERTIFY_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->indexName), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT16_Unmarshal((UINT16 *)&(target->offset), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_MAX_NV_BUFFER_Unmarshal((TPM2B_MAX_NV_BUFFER *)&(target->nvContents), buffer, size);
    return result;
}